

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

void __thiscall nonius::detail::option::option(option *this,option *param_1)

{
  std::__cxx11::string::string((string *)this,(string *)param_1);
  std::__cxx11::string::string((string *)&this->short_form,(string *)&param_1->short_form);
  std::__cxx11::string::string((string *)&this->description,(string *)&param_1->description);
  std::__cxx11::string::string((string *)&this->argument,(string *)&param_1->argument);
  this->multiple = param_1->multiple;
  return;
}

Assistant:

bool matches_short(std::string const& s) const {
                return s == ("-" + short_form);
            }